

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  uint uVar1;
  void *pvVar2;
  __m256i c;
  __m256i c_00;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  bool bVar5;
  int iVar6;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar7;
  __m256i *palVar8;
  __m256i *b_00;
  uint uVar9;
  __m256i *ptr;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  __m256i *palVar14;
  ulong uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  uint uVar28;
  undefined4 in_stack_ffffffffffffff34;
  uint uVar29;
  undefined4 uVar30;
  parasail_matrix_t *ppVar31;
  undefined1 auVar19 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar2 = (profile->profile16).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_striped_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar31 = profile->matrix;
      if (ppVar31 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_avx2_256_16_cold_6();
      }
      else {
        uVar1 = profile->s1Len;
        if ((int)uVar1 < 1) {
          parasail_sw_striped_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_avx2_256_16_cold_1();
        }
        else {
          iVar6 = ppVar31->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar30 = 0;
            uVar15 = (ulong)uVar1 + 0xf >> 4;
            result->flag = result->flag | 0x10200804;
            b = parasail_memalign___m256i(0x20,uVar15);
            palVar7 = parasail_memalign___m256i(0x20,uVar15);
            palVar8 = parasail_memalign___m256i(0x20,uVar15);
            b_00 = parasail_memalign___m256i(0x20,uVar15);
            if ((b_00 != (__m256i *)0x0 && palVar8 != (__m256i *)0x0) &&
                (palVar7 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              uVar16 = (undefined2)open;
              uVar17 = (undefined2)gap;
              c[1]._0_4_ = iVar6;
              c[0] = (longlong)result;
              c[1]._4_4_ = in_stack_ffffffffffffff34;
              c[2]._0_4_ = s2Len;
              c[2]._4_4_ = uVar30;
              c[3] = (longlong)ppVar31;
              parasail_memset___m256i(b,c,uVar15);
              c_00[1]._0_4_ = iVar6;
              c_00[0] = (longlong)result;
              c_00[1]._4_4_ = in_stack_ffffffffffffff34;
              c_00[2]._0_4_ = s2Len;
              c_00[2]._4_4_ = uVar30;
              c_00[3] = (longlong)ppVar31;
              parasail_memset___m256i(b_00,c_00,uVar15);
              auVar3._2_2_ = uVar17;
              auVar3._0_2_ = uVar17;
              auVar3._4_2_ = uVar17;
              auVar3._6_2_ = uVar17;
              auVar3._8_2_ = uVar17;
              auVar3._10_2_ = uVar17;
              auVar3._12_2_ = uVar17;
              auVar3._14_2_ = uVar17;
              auVar3._16_2_ = uVar17;
              auVar3._18_2_ = uVar17;
              auVar3._20_2_ = uVar17;
              auVar3._22_2_ = uVar17;
              auVar3._24_2_ = uVar17;
              auVar3._26_2_ = uVar17;
              auVar3._28_2_ = uVar17;
              auVar3._30_2_ = uVar17;
              auVar4._2_2_ = uVar16;
              auVar4._0_2_ = uVar16;
              auVar4._4_2_ = uVar16;
              auVar4._6_2_ = uVar16;
              auVar4._8_2_ = uVar16;
              auVar4._10_2_ = uVar16;
              auVar4._12_2_ = uVar16;
              auVar4._14_2_ = uVar16;
              auVar4._16_2_ = uVar16;
              auVar4._18_2_ = uVar16;
              auVar4._20_2_ = uVar16;
              auVar4._22_2_ = uVar16;
              auVar4._24_2_ = uVar16;
              auVar4._26_2_ = uVar16;
              auVar4._28_2_ = uVar16;
              auVar4._30_2_ = uVar16;
              uVar13 = 0;
              uVar28 = (uint)uVar15;
              auVar18._8_2_ = 0x8000;
              auVar18._0_8_ = 0x8000800080008000;
              auVar18._10_2_ = 0x8000;
              auVar18._12_2_ = 0x8000;
              auVar18._14_2_ = 0x8000;
              auVar19._16_2_ = 0x8000;
              auVar19._0_16_ = auVar18;
              auVar19._18_2_ = 0x8000;
              auVar19._20_2_ = 0x8000;
              auVar19._22_2_ = 0x8000;
              auVar19._24_2_ = 0x8000;
              auVar19._26_2_ = 0x8000;
              auVar19._28_2_ = 0x8000;
              auVar19._30_2_ = 0x8000;
              uVar9 = 0x8000;
              auVar20._8_2_ = 0x8000;
              auVar20._0_8_ = 0x8000800080008000;
              auVar20._10_2_ = 0x8000;
              auVar20._12_2_ = 0x8000;
              auVar20._14_2_ = 0x8000;
              uVar10 = 0;
              auVar22 = ZEXT3264(auVar19);
              auVar21 = ZEXT3264(auVar19);
              do {
                ptr = b;
                iVar11 = ppVar31->mapper[(byte)s2[uVar10]];
                uVar29 = (uint)uVar10;
                palVar14 = palVar8;
                b = palVar7;
                if (uVar13 == uVar29 - 2) {
                  palVar14 = palVar7;
                  b = palVar8;
                }
                auVar23 = SUB3216(ptr[uVar28 - 1],0);
                auVar26._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar18;
                auVar26._16_16_ = ZEXT116(0) * auVar19._16_16_ + ZEXT116(1) * auVar23;
                auVar26 = vpalignr_avx2((undefined1  [32])ptr[uVar28 - 1],auVar26,0xe);
                auVar23 = vpblendw_avx(auVar26._0_16_,auVar18,1);
                auVar26 = vpblendd_avx2(ZEXT1632(auVar23),auVar26,0xf0);
                lVar12 = 0;
                auVar25 = ZEXT3264(auVar19);
                do {
                  auVar27 = vpaddsw_avx2(auVar26,*(undefined1 (*) [32])
                                                  ((long)pvVar2 +
                                                  lVar12 + uVar15 * (long)iVar11 * 0x20));
                  auVar26 = *(undefined1 (*) [32])((long)*b_00 + lVar12);
                  auVar24 = vpmaxsw_avx2(auVar26,auVar25._0_32_);
                  auVar27 = vpmaxsw_avx2(auVar27,auVar24);
                  *(undefined1 (*) [32])((long)*b + lVar12) = auVar27;
                  auVar24 = vpmaxsw_avx2(auVar27,auVar21._0_32_);
                  auVar21 = ZEXT3264(auVar24);
                  auVar27 = vpsubsw_avx2(auVar27,auVar4);
                  auVar26 = vpsubsw_avx2(auVar26,auVar3);
                  auVar26 = vpmaxsw_avx2(auVar26,auVar27);
                  *(undefined1 (*) [32])((long)*b_00 + lVar12) = auVar26;
                  auVar26 = vpsubsw_avx2(auVar25._0_32_,auVar3);
                  auVar26 = vpmaxsw_avx2(auVar26,auVar27);
                  auVar25 = ZEXT3264(auVar26);
                  auVar26 = *(undefined1 (*) [32])((long)*ptr + lVar12);
                  lVar12 = lVar12 + 0x20;
                } while (uVar15 << 5 != lVar12);
                iVar11 = 0;
                do {
                  auVar27._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar18;
                  auVar27._16_16_ = ZEXT116(0) * auVar19._16_16_ + ZEXT116(1) * auVar25._0_16_;
                  auVar26 = vpalignr_avx2(auVar25._0_32_,auVar27,0xe);
                  auVar23 = vpblendw_avx(auVar26._0_16_,auVar20,1);
                  auVar26 = vpblendd_avx2(ZEXT1632(auVar23),auVar26,0xf0);
                  auVar25 = ZEXT3264(auVar26);
                  lVar12 = 0;
                  do {
                    auVar26 = vpmaxsw_avx2(auVar25._0_32_,*(undefined1 (*) [32])((long)*b + lVar12))
                    ;
                    *(undefined1 (*) [32])((long)*b + lVar12) = auVar26;
                    auVar27 = vpmaxsw_avx2(auVar26,auVar21._0_32_);
                    auVar21 = ZEXT3264(auVar27);
                    auVar26 = vpsubsw_avx2(auVar26,auVar4);
                    auVar24 = vpsubsw_avx2(auVar25._0_32_,auVar3);
                    auVar25 = ZEXT3264(auVar24);
                    auVar26 = vpcmpgtw_avx2(auVar24,auVar26);
                    if ((((((((((((((((((((((((((((((((auVar26 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar26 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar26 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar26 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar26 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar26 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar26 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar26 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar26 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar26 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar26 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar26 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar26 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar26 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar26 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar26 >> 0x7f,0) == '\0')
                                      && (auVar26 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar26 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar26 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar26 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar26 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar26 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar26 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar26 >> 0xbf,0) == '\0') &&
                              (auVar26 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar26 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar26 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar26 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar26 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar26 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar26[0x1f]) goto LAB_0074f67f;
                    lVar12 = lVar12 + 0x20;
                  } while (uVar15 << 5 != lVar12);
                  iVar11 = iVar11 + 1;
                } while (iVar11 != 0x10);
LAB_0074f67f:
                auVar26 = vpcmpgtw_avx2(auVar27,auVar22._0_32_);
                bVar5 = true;
                if ((((((((((((((((((((((((((((((((auVar26 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar26 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar26 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar26 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar26 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar26 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar26 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar26 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar26 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar26 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar26 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar26 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar26 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar26 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar26 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar26 >> 0x7f,0) != '\0') ||
                                  (auVar26 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar26 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar26 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar26 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar26 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar26 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar26 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0xbf,0) != '\0') ||
                          (auVar26 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar26 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar26 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar26 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar26[0x1f] < '\0') {
                  auVar26 = vpermq_avx2(auVar27,0x44);
                  auVar26 = vpmaxsw_avx2(auVar27,auVar26);
                  auVar27 = vpslldq_avx2(auVar26,8);
                  auVar26 = vpmaxsw_avx2(auVar26,auVar27);
                  auVar27 = vpslldq_avx2(auVar26,4);
                  auVar26 = vpmaxsw_avx2(auVar26,auVar27);
                  auVar27 = vpslldq_avx2(auVar26,2);
                  auVar26 = vpmaxsw_avx2(auVar26,auVar27);
                  uVar9 = vpextrw_avx(auVar26._16_16_,7);
                  if ((short)(0x7ffe - (short)iVar6) < (short)uVar9) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    bVar5 = false;
                  }
                  else {
                    auVar26 = vpshufhw_avx2(auVar26,0xff);
                    auVar24._8_4_ = 6;
                    auVar24._0_8_ = 0x600000006;
                    auVar24._12_4_ = 6;
                    auVar24._16_4_ = 6;
                    auVar24._20_4_ = 6;
                    auVar24._24_4_ = 6;
                    auVar24._28_4_ = 6;
                    auVar26 = vpermd_avx2(auVar24,auVar26);
                    auVar22 = ZEXT3264(auVar26);
                    uVar13 = uVar29;
                  }
                }
                if ((!bVar5) ||
                   (uVar10 = uVar10 + 1, palVar7 = ptr, palVar8 = palVar14, uVar29 = s2Len,
                   uVar10 == (uint)s2Len)) {
                  if ((uVar9 & 0xffff) == 0x7fff) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar6 = parasail_result_is_saturated(result);
                  palVar7 = palVar14;
                  if (iVar6 == 0) {
                    palVar8 = ptr;
                    if (uVar13 == uVar29 - 2) {
                      palVar7 = ptr;
                      palVar8 = palVar14;
                    }
                    if (uVar13 == uVar29 - 1) {
                      palVar7 = b;
                      b = palVar14;
                      palVar8 = ptr;
                    }
                    ptr = palVar8;
                    iVar6 = uVar1 - 1;
                    if (((ulong)uVar1 + 0xf & 0x7ffffff0) != 0) {
                      uVar15 = 0;
                      do {
                        if ((*(short *)((long)*palVar7 + uVar15 * 2) == (short)uVar9) &&
                           (iVar11 = ((uint)uVar15 & 0xf) * uVar28 +
                                     ((uint)(uVar15 >> 4) & 0xfffffff), iVar11 < iVar6)) {
                          iVar6 = iVar11;
                        }
                        uVar15 = uVar15 + 1;
                      } while ((uVar28 & 0x7ffffff) << 4 != (int)uVar15);
                    }
                    iVar11 = (short)uVar9 + 0x8000;
                  }
                  else {
                    uVar13 = 0;
                    iVar11 = 0xffff;
                    iVar6 = 0;
                  }
                  result->score = iVar11;
                  result->end_query = iVar6;
                  result->end_ref = uVar13;
                  parasail_free(b_00);
                  parasail_free(palVar7);
                  parasail_free(ptr);
                  parasail_free(b);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int16_t maxp = 0;
    __m256i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm256_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi16(
            _mm256_set_epi16(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}